

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O2

int cdef_sb_row_worker_hook(void *arg1,void *arg2)

{
  uint8_t uVar1;
  AV1_COMMON *cm;
  pthread_mutex_t *__mutex;
  MACROBLOCKD *xd;
  int iVar2;
  int v_start;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int cur_fbr;
  
  cm = *arg2;
  iVar4 = ((cm->mi_params).mi_rows + 0xf) / 0x10;
  __mutex = *arg1;
  iVar2 = _setjmp((__jmp_buf_tag *)((long)arg2 + 0x130));
  if (iVar2 == 0) {
    *(undefined4 *)((long)arg2 + 0x128) = 1;
    uVar1 = cm->seq_params->monochrome;
    while ((pthread_mutex_lock(*arg1), *(char *)((long)arg1 + 0x1c) == '\0' &&
           (*(int *)((long)arg1 + 0x10) == 0))) {
      iVar2 = *(int *)((long)arg1 + 0x14);
      *(int *)((long)arg1 + 0x14) = iVar2 + 1;
      if (iVar2 + 1 == iVar4) {
        *(undefined4 *)((long)arg1 + 0x10) = 1;
      }
      pthread_mutex_unlock(*arg1);
      xd = *(MACROBLOCKD **)((long)arg2 + 8);
      av1_cdef_fb_row(cm,xd,(uint16_t **)((long)arg2 + 0x30),(uint16_t **)((long)arg2 + 0x10),
                      *(uint16_t **)((long)arg2 + 0x28),iVar2,
                      *(cdef_init_fb_row_t *)((long)arg2 + 0x48),(AV1CdefSyncData *)arg1,
                      (aom_internal_error_info *)((long)arg2 + 0x58));
      if (*(int *)((long)arg2 + 0x50) != 0) {
        piVar7 = &xd->plane[0].subsampling_y;
        for (lVar3 = 0; (ulong)(uVar1 == '\0') * 2 + 1 != lVar3; lVar3 = lVar3 + 1) {
          iVar6 = 0x10 << (2U - (char)*piVar7 & 0x1f);
          v_start = iVar2 * iVar6;
          iVar6 = iVar6 + v_start;
          iVar5 = *(int *)((long)(cm->cur_frame->buf).store_buf_adr +
                          (ulong)(lVar3 != 0) * 4 + -0x30);
          if (iVar5 <= iVar6) {
            iVar6 = iVar5;
          }
          aom_extend_frame_borders_plane_row_c(&cm->cur_frame->buf,(int)lVar3,v_start,iVar6);
          piVar7 = piVar7 + 0x28c;
        }
      }
    }
    pthread_mutex_unlock(*arg1);
    *(undefined4 *)((long)arg2 + 0x128) = 0;
    iVar2 = 1;
  }
  else {
    *(undefined4 *)((long)arg2 + 0x128) = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)((long)arg1 + 0x1c) = 1;
    pthread_mutex_unlock(__mutex);
    iVar5 = 0;
    iVar2 = 0;
    if (iVar4 < 1) {
      iVar4 = iVar2;
    }
    for (; iVar4 != iVar5; iVar5 = iVar5 + 1) {
      cdef_row_mt_sync_write((AV1CdefSync *)arg1,iVar5);
    }
  }
  return iVar2;
}

Assistant:

static int cdef_sb_row_worker_hook(void *arg1, void *arg2) {
  AV1CdefSync *const cdef_sync = (AV1CdefSync *)arg1;
  AV1CdefWorkerData *const cdef_worker = (AV1CdefWorkerData *)arg2;
  AV1_COMMON *cm = cdef_worker->cm;
  const int nvfb = (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;

#if CONFIG_MULTITHREAD
  pthread_mutex_t *job_mutex_ = cdef_sync->mutex_;
#endif
  struct aom_internal_error_info *const error_info = &cdef_worker->error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(job_mutex_);
    cdef_sync->cdef_mt_exit = true;
    pthread_mutex_unlock(job_mutex_);
#endif
    // In case of cdef row-multithreading, the worker on a filter block row
    // (fbr) waits for the line buffers (top and bottom) copy of the above row.
    // Hence, in case a thread (main/worker) encounters an error before copying
    // of the line buffers, update that line buffer copy is complete in order to
    // avoid dependent workers waiting indefinitely.
    set_cdef_init_fb_row_done(cdef_sync, nvfb);
    return 0;
  }
  error_info->setjmp = 1;

  volatile int cur_fbr;
  const int num_planes = av1_num_planes(cm);
  while (get_cdef_row_next_job(cdef_sync, &cur_fbr, nvfb)) {
    MACROBLOCKD *xd = cdef_worker->xd;
    av1_cdef_fb_row(cm, xd, cdef_worker->linebuf, cdef_worker->colbuf,
                    cdef_worker->srcbuf, cur_fbr,
                    cdef_worker->cdef_init_fb_row_fn, cdef_sync, error_info);
    if (cdef_worker->do_extend_border) {
      for (int plane = 0; plane < num_planes; ++plane) {
        const YV12_BUFFER_CONFIG *ybf = &cm->cur_frame->buf;
        const int is_uv = plane > 0;
        const int mi_high = MI_SIZE_LOG2 - xd->plane[plane].subsampling_y;
        const int unit_height = MI_SIZE_64X64 << mi_high;
        const int v_start = cur_fbr * unit_height;
        const int v_end =
            AOMMIN(v_start + unit_height, ybf->crop_heights[is_uv]);
        aom_extend_frame_borders_plane_row(ybf, plane, v_start, v_end);
      }
    }
  }
  error_info->setjmp = 0;
  return 1;
}